

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_int8.h
# Opt level: O0

void ncnn::compute_A_tile_fp32_int8_scales
               (Mat *A,Mat *scales,float B_scale,Mat *out_descales,int i,int max_ii)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined8 uVar11;
  undefined1 auVar13 [32];
  float *pfVar12;
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  undefined1 auVar14 [64];
  float in_XMM0_Da;
  undefined1 auVar15 [16];
  __m128 _out_descale_2;
  __m128 _scale_2;
  __m128 _absmax1_2;
  __m128 _absmax0_2;
  __m256 _absmax1_1;
  __m256 _absmax0_1;
  __m256 _out_descale_1;
  __m256 _scale_1;
  __m256 _absmax1;
  __m256 _absmax0;
  __m512 _out_descale;
  __m512 _scale;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int kk;
  float absmax;
  __m128 _absmax;
  __m256 _absmax_avx;
  __m512 _absmax_avx512;
  float *ptr;
  int ii;
  __m128 _v127_B_scale;
  __m128 _v127;
  __m256 _v127_B_scale_avx;
  __m256 _v127_avx;
  __m512 _v127_B_scale_avx512;
  __m512 _v127_avx512;
  int size;
  int max_ii_packed;
  float *pods;
  float *ps;
  float v127_B_scale;
  int A_hstep;
  int elempack;
  __m512 abs_mask;
  __m256 abs_mask_1;
  __m128 abs_mask_2;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m256 x256;
  __m128 x32_1;
  __m128 x64_1;
  __m128 x128_1;
  __m128 x32_2;
  __m128 x64_2;
  int local_1510;
  float local_150c;
  float local_1508;
  float local_1504;
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  float local_1374;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  int local_12f8;
  float local_12f4;
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [64];
  undefined1 (*local_1270) [64];
  int local_1264;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 local_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  int local_1168;
  int local_1164;
  float *local_1160;
  float *local_1158;
  float local_114c;
  int local_1148;
  int local_1144;
  int local_113c;
  long *local_1120;
  long *local_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  float *local_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float *local_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  float *local_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  float *local_fd0;
  undefined1 (*local_fc8) [64];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float *local_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  float *local_f58;
  undefined1 (*local_f50) [64];
  undefined1 (*local_f48) [64];
  undefined1 local_f40 [64];
  undefined4 local_ec4;
  undefined1 local_ec0 [64];
  float local_e44;
  undefined1 local_e40 [40];
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined4 local_df0;
  undefined4 local_dec;
  float local_de8;
  undefined4 local_de4;
  undefined4 local_de0;
  undefined4 uStack_ddc;
  undefined4 uStack_dd8;
  undefined4 uStack_dd4;
  undefined4 local_dc4;
  float local_dc0;
  float fStack_dbc;
  float fStack_db8;
  float fStack_db4;
  float local_da4;
  undefined4 local_da0;
  undefined4 uStack_d9c;
  undefined4 uStack_d98;
  undefined4 uStack_d94;
  undefined4 local_d84;
  undefined1 local_d80 [16];
  undefined1 auStack_d70 [16];
  undefined4 local_d60;
  undefined4 local_d5c;
  undefined4 local_d58;
  undefined4 local_d54;
  undefined4 local_d50;
  undefined4 local_d4c;
  undefined4 local_d48;
  undefined4 local_d44;
  undefined1 local_d40 [16];
  undefined1 auStack_d30 [16];
  float local_d20;
  float local_d1c;
  float local_d18;
  float local_d14;
  float local_d10;
  float local_d0c;
  float local_d08;
  float local_d04;
  undefined1 local_d00 [16];
  undefined1 auStack_cf0 [16];
  undefined4 local_ce0;
  undefined4 local_cdc;
  undefined4 local_cd8;
  undefined4 local_cd4;
  undefined4 local_cd0;
  undefined4 local_ccc;
  undefined4 local_cc8;
  undefined4 local_cc4;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [64];
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [64];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [64];
  undefined4 local_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [16];
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined4 local_8e4;
  undefined1 local_8e0 [32];
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined1 local_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined4 local_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined1 local_7f0 [16];
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [24];
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined1 local_690 [16];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined1 local_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 local_560 [16];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [64];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [16];
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  auVar13._8_8_ = local_480._8_8_;
  auVar13._0_8_ = local_480._0_8_;
  local_1144 = (int)in_RDI[3];
  if ((int)in_RDI[5] == 3) {
    local_1510 = (int)in_RDI[8];
  }
  else {
    local_1510 = *(int *)((long)in_RDI + 0x2c);
  }
  local_1148 = local_1510;
  local_114c = in_XMM0_Da * 127.0;
  local_1158 = (float *)(*in_RSI + (long)in_ECX * 4);
  local_1160 = (float *)(*in_RDX + (long)in_ECX * 4);
  local_1164 = in_R8D / local_1144;
  local_1168 = *(int *)((long)in_RDI + 0x2c) * local_1144;
  local_df0 = 0x42fe0000;
  _local_e40 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
  local_11c0 = local_e40._0_8_;
  uStack_11b8 = local_e40._8_8_;
  uStack_11b0 = local_e40._16_8_;
  uStack_11a8 = local_e40._24_8_;
  uStack_11a0 = local_e40._32_8_;
  uStack_1198 = uStack_e18;
  uStack_1190 = uStack_e10;
  uStack_1188 = uStack_e08;
  local_ec0 = vbroadcastss_avx512f(ZEXT416((uint)local_114c));
  local_1200 = local_ec0._0_8_;
  uStack_11f8 = local_ec0._8_8_;
  uStack_11f0 = local_ec0._16_8_;
  uStack_11e8 = local_ec0._24_8_;
  uStack_11e0 = local_ec0._32_8_;
  uStack_11d8 = local_ec0._40_8_;
  uStack_11d0 = local_ec0._48_8_;
  uStack_11c8 = local_ec0._56_8_;
  local_de4 = 0x42fe0000;
  local_d44 = 0x42fe0000;
  local_d48 = 0x42fe0000;
  local_d4c = 0x42fe0000;
  local_d50 = 0x42fe0000;
  local_d54 = 0x42fe0000;
  local_d58 = 0x42fe0000;
  local_d5c = 0x42fe0000;
  local_d60 = 0x42fe0000;
  auVar2 = vinsertps_avx(ZEXT416(0x42fe0000),ZEXT416(0x42fe0000),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0x42fe0000),0x20);
  local_d80 = vinsertps_avx(auVar2,ZEXT416(0x42fe0000),0x30);
  auVar2 = vinsertps_avx(ZEXT416(0x42fe0000),ZEXT416(0x42fe0000),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0x42fe0000),0x20);
  auStack_d70 = vinsertps_avx(auVar2,ZEXT416(0x42fe0000),0x30);
  local_1220 = local_d80._0_8_;
  uStack_1218 = local_d80._8_8_;
  uStack_1210 = auStack_d70._0_8_;
  uStack_1208 = auStack_d70._8_8_;
  auVar2 = vinsertps_avx(ZEXT416((uint)local_114c),ZEXT416((uint)local_114c),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_114c),0x20);
  local_d40 = vinsertps_avx(auVar2,ZEXT416((uint)local_114c),0x30);
  auVar2 = vinsertps_avx(ZEXT416((uint)local_114c),ZEXT416((uint)local_114c),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_114c),0x20);
  auStack_d30 = vinsertps_avx(auVar2,ZEXT416((uint)local_114c),0x30);
  local_1240 = local_d40._0_8_;
  uStack_1238 = local_d40._8_8_;
  uStack_1230 = auStack_d30._0_8_;
  uStack_1228 = auStack_d30._8_8_;
  local_d84 = 0x42fe0000;
  local_da0 = 0x42fe0000;
  uStack_d9c = 0x42fe0000;
  uStack_d98 = 0x42fe0000;
  uStack_d94 = 0x42fe0000;
  local_1250 = 0x42fe000042fe0000;
  uStack_1248 = 0x42fe000042fe0000;
  local_1260 = CONCAT44(local_114c,local_114c);
  uStack_1258 = CONCAT44(local_114c,local_114c);
  local_113c = in_ECX;
  local_1120 = in_RDI;
  local_e44 = local_114c;
  local_de8 = local_114c;
  local_dc0 = local_114c;
  fStack_dbc = local_114c;
  fStack_db8 = local_114c;
  fStack_db4 = local_114c;
  local_da4 = local_114c;
  local_d20 = local_114c;
  local_d1c = local_114c;
  local_d18 = local_114c;
  local_d14 = local_114c;
  local_d10 = local_114c;
  local_d0c = local_114c;
  local_d08 = local_114c;
  local_d04 = local_114c;
  for (local_1264 = 0; local_1264 < local_1164; local_1264 = local_1264 + 1) {
    local_1108 = local_1120;
    local_1270 = (undefined1 (*) [64])
                 (*local_1120 + (long)((local_113c + local_1264 * local_1144) * local_1148) * 4);
    local_ec4 = 0;
    local_f40 = vbroadcastss_avx512f(ZEXT416(0));
    local_dec = 0;
    local_cc4 = 0;
    local_cc8 = 0;
    local_ccc = 0;
    local_cd0 = 0;
    local_cd4 = 0;
    local_cd8 = 0;
    local_cdc = 0;
    local_ce0 = 0;
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    local_d00 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    auStack_cf0 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
    local_12e0._16_8_ = auStack_cf0._0_8_;
    local_12e0._0_16_ = local_d00;
    local_12e0._24_8_ = auStack_cf0._8_8_;
    local_dc4 = 0;
    local_de0 = 0;
    uStack_ddc = 0;
    uStack_dd8 = 0;
    uStack_dd4 = 0;
    local_12f0 = ZEXT816(0);
    local_12f4 = 0.0;
    local_12c0 = local_f40;
    for (local_12f8 = 0; local_12f8 + 0xf < local_1168; local_12f8 = local_12f8 + 0x10) {
      local_fc8 = local_1270;
      local_1340 = *(undefined8 *)*local_1270;
      uStack_1338 = *(undefined8 *)(*local_1270 + 8);
      uStack_1330 = *(undefined8 *)(*local_1270 + 0x10);
      uStack_1328 = *(undefined8 *)(*local_1270 + 0x18);
      uStack_1320 = *(undefined8 *)(*local_1270 + 0x20);
      uStack_1318 = *(undefined8 *)(*local_1270 + 0x28);
      uStack_1310 = *(undefined8 *)(*local_1270 + 0x30);
      uStack_1308 = *(undefined8 *)(*local_1270 + 0x38);
      local_bc0 = local_12c0._0_8_;
      uStack_bb8 = local_12c0._8_8_;
      uStack_bb0 = local_12c0._16_8_;
      uStack_ba8 = local_12c0._24_8_;
      uStack_ba0 = local_12c0._32_8_;
      uStack_b98 = local_12c0._40_8_;
      uStack_b90 = local_12c0._48_8_;
      uStack_b88 = local_12c0._56_8_;
      local_a84 = 0x7fffffff;
      auVar14 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      local_b00 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(local_b00);
      local_540 = vmovdqa64_avx512f(auVar14);
      local_b80 = vmovdqa64_avx512f(local_540);
      local_4c0 = local_b80._0_8_;
      uStack_4b8 = local_b80._8_8_;
      uStack_4b0 = local_b80._16_8_;
      uStack_4a8 = local_b80._24_8_;
      uStack_4a0 = local_b80._32_8_;
      uStack_498 = local_b80._40_8_;
      uStack_490 = local_b80._48_8_;
      uStack_488 = local_b80._56_8_;
      local_c00 = vpandd_avx512f(local_b80,*local_1270);
      local_12c0 = vmaxps_avx512f(local_12c0,local_c00);
      local_1270 = local_1270 + 1;
      local_b40 = local_1340;
      uStack_b38 = uStack_1338;
      uStack_b30 = uStack_1330;
      uStack_b28 = uStack_1328;
      uStack_b20 = uStack_1320;
      uStack_b18 = uStack_1318;
      uStack_b10 = uStack_1310;
      uStack_b08 = uStack_1308;
      local_500 = local_1340;
      uStack_4f8 = uStack_1338;
      uStack_4f0 = uStack_1330;
      uStack_4e8 = uStack_1328;
      uStack_4e0 = uStack_1320;
      uStack_4d8 = uStack_1318;
      uStack_4d0 = uStack_1310;
      uStack_4c8 = uStack_1308;
    }
    for (; local_12f8 + 7 < local_1168; local_12f8 = local_12f8 + 8) {
      local_f50 = local_1270;
      local_1360 = *(undefined8 *)*local_1270;
      uStack_1358 = *(undefined8 *)(*local_1270 + 8);
      uStack_1350 = *(undefined8 *)(*local_1270 + 0x10);
      uStack_1348 = *(undefined8 *)(*local_1270 + 0x18);
      local_960 = local_12e0._0_8_;
      uStack_958 = local_12e0._8_8_;
      uStack_950 = local_12e0._16_8_;
      uStack_948 = local_12e0._24_8_;
      local_8e4 = 0x7fffffff;
      local_8b0 = 0x7fffffff;
      auVar13._0_16_ = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar13._0_16_ = vpinsrd_avx(auVar13._0_16_,0x7fffffff,2);
      auVar2 = vpinsrd_avx(auVar13._0_16_,0x7fffffff,3);
      auVar13._0_16_ = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar13._0_16_ = vpinsrd_avx(auVar13._0_16_,0x7fffffff,2);
      auVar13._0_16_ = vpinsrd_avx(auVar13._0_16_,0x7fffffff,3);
      auVar13._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar13._0_16_;
      auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
      local_8e0._16_8_ = auVar13._16_8_;
      uStack_470 = local_8e0._16_8_;
      local_8e0._24_8_ = auVar13._24_8_;
      uStack_468 = local_8e0._24_8_;
      uStack_930 = local_8e0._16_8_;
      uStack_928 = local_8e0._24_8_;
      uStack_430 = local_8e0._16_8_;
      uStack_428 = local_8e0._24_8_;
      auVar3._16_8_ = local_8e0._16_8_;
      auVar3._0_16_ = auVar13._0_16_;
      auVar3._24_8_ = local_8e0._24_8_;
      local_980 = vpand_avx2(auVar3,*(undefined1 (*) [32])*local_1270);
      local_12e0 = vmaxps_avx(local_12e0,local_980);
      local_1270 = (undefined1 (*) [64])(*local_1270 + 0x20);
      local_920 = local_1360;
      uStack_918 = uStack_1358;
      uStack_910 = uStack_1350;
      uStack_908 = uStack_1348;
      local_8e0 = auVar13;
      local_8ac = local_8b0;
      local_8a8 = local_8b0;
      local_8a4 = local_8b0;
      local_8a0 = local_8b0;
      local_89c = local_8b0;
      local_898 = local_8b0;
      local_894 = local_8b0;
      local_460 = local_1360;
      uStack_458 = uStack_1358;
      uStack_450 = uStack_1350;
      uStack_448 = uStack_1348;
      local_940 = auVar13._0_16_;
      local_440 = auVar13._0_16_;
    }
    for (; local_480 = auVar13._0_16_, local_12f8 + 3 < local_1168; local_12f8 = local_12f8 + 4) {
      local_f48 = local_1270;
      local_1370 = *(undefined8 *)*local_1270;
      uStack_1368 = *(undefined8 *)(*local_1270 + 8);
      local_840 = local_12f0._0_8_;
      uStack_838 = local_12f0._8_8_;
      local_804 = 0x7fffffff;
      local_7e0 = 0x7fffffff;
      auVar2 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar2 = vpinsrd_avx(auVar2,0x7fffffff,2);
      local_7f0 = vpinsrd_avx(auVar2,0x7fffffff,3);
      local_800 = local_7f0._0_8_;
      uStack_7f8 = local_7f0._8_8_;
      local_830 = local_7f0._0_8_;
      uStack_828 = local_7f0._8_8_;
      local_410 = local_7f0._0_8_;
      uStack_408 = local_7f0._8_8_;
      local_850 = vpand_avx(local_7f0,*(undefined1 (*) [16])*local_1270);
      local_12f0 = vmaxps_avx(local_12f0,local_850);
      local_1270 = (undefined1 (*) [64])(*local_1270 + 0x10);
      local_820 = local_1370;
      uStack_818 = uStack_1368;
      local_7dc = local_7e0;
      local_7d8 = local_7e0;
      local_7d4 = local_7e0;
      local_420 = local_1370;
      uStack_418 = uStack_1368;
    }
    for (; local_12f8 < local_1168; local_12f8 = local_12f8 + 1) {
      auVar15._8_4_ = 0x7fffffff;
      auVar15._0_8_ = 0x7fffffff7fffffff;
      auVar15._12_4_ = 0x7fffffff;
      auVar13._0_16_ = vpand_avx(ZEXT416(*(uint *)*local_1270),auVar15);
      local_1374 = auVar13._0_4_;
      pfVar12 = std::max<float>(&local_12f4,&local_1374);
      local_12f4 = *pfVar12;
      local_1270 = (undefined1 (*) [64])(*local_1270 + 4);
    }
    if (local_1144 == 0x10) {
      local_c0 = local_11c0;
      uStack_b8 = uStack_11b8;
      uStack_b0 = uStack_11b0;
      uStack_a8 = uStack_11a8;
      uStack_a0 = uStack_11a0;
      uStack_98 = uStack_1198;
      uStack_90 = uStack_1190;
      uStack_88 = uStack_1188;
      local_100 = local_12c0._0_8_;
      uStack_f8 = local_12c0._8_8_;
      uStack_f0 = local_12c0._16_8_;
      uStack_e8 = local_12c0._24_8_;
      uStack_e0 = local_12c0._32_8_;
      uStack_d8 = local_12c0._40_8_;
      uStack_d0 = local_12c0._48_8_;
      uStack_c8 = local_12c0._56_8_;
      auVar10._8_8_ = uStack_11b8;
      auVar10._0_8_ = local_11c0;
      auVar10._16_8_ = uStack_11b0;
      auVar10._24_8_ = uStack_11a8;
      auVar10._32_8_ = uStack_11a0;
      auVar10._40_8_ = uStack_1198;
      auVar10._48_8_ = uStack_1190;
      auVar10._56_8_ = uStack_1188;
      local_13c0 = vdivps_avx512f(auVar10,local_12c0);
      local_140 = local_12c0._0_8_;
      uStack_138 = local_12c0._8_8_;
      uStack_130 = local_12c0._16_8_;
      uStack_128 = local_12c0._24_8_;
      uStack_120 = local_12c0._32_8_;
      uStack_118 = local_12c0._40_8_;
      uStack_110 = local_12c0._48_8_;
      uStack_108 = local_12c0._56_8_;
      local_180 = local_1200;
      uStack_178 = uStack_11f8;
      uStack_170 = uStack_11f0;
      uStack_168 = uStack_11e8;
      uStack_160 = uStack_11e0;
      uStack_158 = uStack_11d8;
      uStack_150 = uStack_11d0;
      uStack_148 = uStack_11c8;
      auVar14._8_8_ = uStack_11f8;
      auVar14._0_8_ = local_1200;
      auVar14._16_8_ = uStack_11f0;
      auVar14._24_8_ = uStack_11e8;
      auVar14._32_8_ = uStack_11e0;
      auVar14._40_8_ = uStack_11d8;
      auVar14._48_8_ = uStack_11d0;
      auVar14._56_8_ = uStack_11c8;
      local_1400 = vdivps_avx512f(local_12c0,auVar14);
      local_1008 = local_1158;
      local_1080 = local_13c0._0_8_;
      uStack_1078 = local_13c0._8_8_;
      uStack_1070 = local_13c0._16_8_;
      uStack_1068 = local_13c0._24_8_;
      uStack_1060 = local_13c0._32_8_;
      uStack_1058 = local_13c0._40_8_;
      uStack_1050 = local_13c0._48_8_;
      uStack_1048 = local_13c0._56_8_;
      *(undefined8 *)local_1158 = local_13c0._0_8_;
      *(undefined8 *)(local_1158 + 2) = local_13c0._8_8_;
      *(undefined8 *)(local_1158 + 4) = local_13c0._16_8_;
      *(undefined8 *)(local_1158 + 6) = local_13c0._24_8_;
      *(undefined8 *)(local_1158 + 8) = local_13c0._32_8_;
      *(undefined8 *)(local_1158 + 10) = local_13c0._40_8_;
      *(undefined8 *)(local_1158 + 0xc) = local_13c0._48_8_;
      *(undefined8 *)(local_1158 + 0xe) = local_13c0._56_8_;
      local_1088 = local_1160;
      local_1100 = local_1400._0_8_;
      uStack_10f8 = local_1400._8_8_;
      uStack_10f0 = local_1400._16_8_;
      uStack_10e8 = local_1400._24_8_;
      uStack_10e0 = local_1400._32_8_;
      uStack_10d8 = local_1400._40_8_;
      uStack_10d0 = local_1400._48_8_;
      uStack_10c8 = local_1400._56_8_;
      *(undefined8 *)local_1160 = local_1400._0_8_;
      *(undefined8 *)(local_1160 + 2) = local_1400._8_8_;
      *(undefined8 *)(local_1160 + 4) = local_1400._16_8_;
      *(undefined8 *)(local_1160 + 6) = local_1400._24_8_;
      *(undefined8 *)(local_1160 + 8) = local_1400._32_8_;
      *(undefined8 *)(local_1160 + 10) = local_1400._40_8_;
      *(undefined8 *)(local_1160 + 0xc) = local_1400._48_8_;
      *(undefined8 *)(local_1160 + 0xe) = local_1400._56_8_;
      local_1158 = local_1158 + 0x10;
      local_1160 = local_1160 + 0x10;
    }
    auVar3 = local_12c0._0_32_;
    if (local_1144 == 8) {
      local_380 = local_12c0._0_8_;
      uStack_378 = local_12c0._8_8_;
      uStack_370 = local_12c0._16_8_;
      uStack_368 = local_12c0._24_8_;
      uStack_360 = local_12c0._32_8_;
      uStack_358 = local_12c0._40_8_;
      uStack_350 = local_12c0._48_8_;
      uStack_348 = local_12c0._56_8_;
      local_1420 = local_12c0._0_8_;
      uStack_1418 = local_12c0._8_8_;
      uStack_1410 = local_12c0._16_8_;
      uStack_1408 = local_12c0._24_8_;
      local_c80 = local_12c0._0_8_;
      uStack_c78 = local_12c0._8_8_;
      uStack_c70 = local_12c0._16_8_;
      uStack_c68 = local_12c0._24_8_;
      uStack_c60 = local_12c0._32_8_;
      uStack_c58 = local_12c0._40_8_;
      uStack_c50 = local_12c0._48_8_;
      uStack_c48 = local_12c0._56_8_;
      local_c20 = local_12c0._32_8_;
      uStack_c18 = local_12c0._40_8_;
      uStack_c10 = local_12c0._48_8_;
      uStack_c08 = local_12c0._56_8_;
      local_1440 = local_12c0._32_8_;
      uStack_1438 = local_12c0._40_8_;
      uStack_1430 = local_12c0._48_8_;
      uStack_1428 = local_12c0._56_8_;
      local_9a0 = local_12e0._0_8_;
      uStack_998 = local_12e0._8_8_;
      uStack_990 = local_12e0._16_8_;
      uStack_988 = local_12e0._24_8_;
      local_9c0 = local_12c0._0_8_;
      uStack_9b8 = local_12c0._8_8_;
      uStack_9b0 = local_12c0._16_8_;
      uStack_9a8 = local_12c0._24_8_;
      auVar13 = vmaxps_avx(local_12e0,auVar3);
      local_12e0._0_8_ = auVar13._0_8_;
      local_12e0._8_8_ = auVar13._8_8_;
      local_12e0._16_8_ = auVar13._16_8_;
      local_12e0._24_8_ = auVar13._24_8_;
      local_9e0 = local_12e0._0_8_;
      uStack_9d8 = local_12e0._8_8_;
      uStack_9d0 = local_12e0._16_8_;
      uStack_9c8 = local_12e0._24_8_;
      local_a00 = local_12c0._32_8_;
      uStack_9f8 = local_12c0._40_8_;
      uStack_9f0 = local_12c0._48_8_;
      uStack_9e8 = local_12c0._56_8_;
      local_12e0 = vmaxps_avx(auVar13,local_12c0._32_32_);
      local_1a0 = local_1220;
      uStack_198 = uStack_1218;
      uStack_190 = uStack_1210;
      uStack_188 = uStack_1208;
      local_1c0 = local_12e0._0_8_;
      uStack_1b8 = local_12e0._8_8_;
      uStack_1b0 = local_12e0._16_8_;
      uStack_1a8 = local_12e0._24_8_;
      auVar9._8_8_ = uStack_1218;
      auVar9._0_8_ = local_1220;
      auVar9._16_8_ = uStack_1210;
      auVar9._24_8_ = uStack_1208;
      local_1460 = vdivps_avx(auVar9,local_12e0);
      local_1e0 = local_12e0._0_8_;
      uStack_1d8 = local_12e0._8_8_;
      uStack_1d0 = local_12e0._16_8_;
      uStack_1c8 = local_12e0._24_8_;
      local_200 = local_1240;
      uStack_1f8 = uStack_1238;
      uStack_1f0 = uStack_1230;
      uStack_1e8 = uStack_1228;
      auVar8._8_8_ = uStack_1238;
      auVar8._0_8_ = local_1240;
      auVar8._16_8_ = uStack_1230;
      auVar8._24_8_ = uStack_1228;
      local_1480 = vdivps_avx(local_12e0,auVar8);
      local_f58 = local_1158;
      local_f80 = local_1460._0_8_;
      uStack_f78 = local_1460._8_8_;
      uStack_f70 = local_1460._16_8_;
      uStack_f68 = local_1460._24_8_;
      *(undefined8 *)local_1158 = local_1460._0_8_;
      *(undefined8 *)(local_1158 + 2) = local_1460._8_8_;
      *(undefined8 *)(local_1158 + 4) = local_1460._16_8_;
      *(undefined8 *)(local_1158 + 6) = local_1460._24_8_;
      local_f88 = local_1160;
      local_fc0 = local_1480._0_8_;
      uStack_fb8 = local_1480._8_8_;
      uStack_fb0 = local_1480._16_8_;
      uStack_fa8 = local_1480._24_8_;
      *(undefined8 *)local_1160 = local_1480._0_8_;
      *(undefined8 *)(local_1160 + 2) = local_1480._8_8_;
      *(undefined8 *)(local_1160 + 4) = local_1480._16_8_;
      *(undefined8 *)(local_1160 + 6) = local_1480._24_8_;
      local_1158 = local_1158 + 8;
      local_1160 = local_1160 + 8;
    }
    if (local_1144 == 4) {
      local_3c0 = local_12c0._0_8_;
      uStack_3b8 = local_12c0._8_8_;
      uStack_3b0 = local_12c0._16_8_;
      uStack_3a8 = local_12c0._24_8_;
      uStack_3a0 = local_12c0._32_8_;
      uStack_398 = local_12c0._40_8_;
      uStack_390 = local_12c0._48_8_;
      uStack_388 = local_12c0._56_8_;
      local_14a0 = local_12c0._0_8_;
      uStack_1498 = local_12c0._8_8_;
      uStack_1490 = local_12c0._16_8_;
      uStack_1488 = local_12c0._24_8_;
      local_cc0 = local_12c0._0_8_;
      uStack_cb8 = local_12c0._8_8_;
      uStack_cb0 = local_12c0._16_8_;
      uStack_ca8 = local_12c0._24_8_;
      uStack_ca0 = local_12c0._32_8_;
      uStack_c98 = local_12c0._40_8_;
      uStack_c90 = local_12c0._48_8_;
      uStack_c88 = local_12c0._56_8_;
      local_c40 = local_12c0._32_8_;
      uStack_c38 = local_12c0._40_8_;
      uStack_c30 = local_12c0._48_8_;
      uStack_c28 = local_12c0._56_8_;
      local_14c0 = local_12c0._32_8_;
      uStack_14b8 = local_12c0._40_8_;
      uStack_14b0 = local_12c0._48_8_;
      uStack_14a8 = local_12c0._56_8_;
      local_a20 = local_12e0._0_8_;
      uStack_a18 = local_12e0._8_8_;
      uStack_a10 = local_12e0._16_8_;
      uStack_a08 = local_12e0._24_8_;
      local_a40 = local_12c0._0_8_;
      uStack_a38 = local_12c0._8_8_;
      uStack_a30 = local_12c0._16_8_;
      uStack_a28 = local_12c0._24_8_;
      auVar13 = vmaxps_avx(local_12e0,auVar3);
      local_12e0._0_8_ = auVar13._0_8_;
      local_12e0._8_8_ = auVar13._8_8_;
      local_12e0._16_8_ = auVar13._16_8_;
      local_12e0._24_8_ = auVar13._24_8_;
      local_a60 = local_12e0._0_8_;
      uStack_a58 = local_12e0._8_8_;
      uStack_a50 = local_12e0._16_8_;
      uStack_a48 = local_12e0._24_8_;
      local_a80 = local_12c0._32_8_;
      uStack_a78 = local_12c0._40_8_;
      uStack_a70 = local_12c0._48_8_;
      uStack_a68 = local_12c0._56_8_;
      local_12e0 = vmaxps_avx(auVar13,local_12c0._32_32_);
      local_300 = local_12e0._0_8_;
      uStack_2f8 = local_12e0._8_8_;
      uStack_2f0 = local_12e0._16_8_;
      uStack_2e8 = local_12e0._24_8_;
      local_14d0 = local_12e0._0_8_;
      uStack_14c8 = local_12e0._8_8_;
      local_14e0 = local_12e0._16_8_;
      uStack_14d8 = local_12e0._24_8_;
      local_860 = local_12f0._0_8_;
      uStack_858 = local_12f0._8_8_;
      local_870 = local_12e0._0_8_;
      uStack_868 = local_12e0._8_8_;
      auVar13._0_16_ = vmaxps_avx(local_12f0,local_12e0._0_16_);
      local_12f0._0_8_ = auVar13._0_8_;
      local_12f0._8_8_ = auVar13._8_8_;
      local_880 = local_12f0._0_8_;
      uStack_878 = local_12f0._8_8_;
      local_890 = local_12e0._16_8_;
      uStack_888 = local_12e0._24_8_;
      local_12f0 = vmaxps_avx(auVar13._0_16_,local_12e0._16_16_);
      local_210 = local_1250;
      uStack_208 = uStack_1248;
      local_220 = local_12f0._0_8_;
      uStack_218 = local_12f0._8_8_;
      auVar7._8_8_ = uStack_1248;
      auVar7._0_8_ = local_1250;
      local_14f0 = vdivps_avx(auVar7,local_12f0);
      local_230 = local_12f0._0_8_;
      uStack_228 = local_12f0._8_8_;
      local_240 = local_1260;
      uStack_238 = uStack_1258;
      auVar2._8_8_ = uStack_1258;
      auVar2._0_8_ = local_1260;
      local_1500 = vdivps_avx(local_12f0,auVar2);
      local_fd0 = local_1158;
      local_fe0 = local_14f0._0_8_;
      uStack_fd8 = local_14f0._8_8_;
      *(undefined8 *)local_1158 = local_14f0._0_8_;
      *(undefined8 *)(local_1158 + 2) = local_14f0._8_8_;
      local_fe8 = local_1160;
      local_1000 = local_1500._0_8_;
      uStack_ff8 = local_1500._8_8_;
      *(undefined8 *)local_1160 = local_1500._0_8_;
      *(undefined8 *)(local_1160 + 2) = local_1500._8_8_;
      local_1158 = local_1158 + 4;
      local_1160 = local_1160 + 4;
    }
    if (local_1144 == 1) {
      local_780 = local_12c0._0_8_;
      uStack_778 = local_12c0._8_8_;
      uStack_770 = local_12c0._16_8_;
      uStack_768 = local_12c0._24_8_;
      uStack_760 = local_12c0._32_8_;
      uStack_758 = local_12c0._40_8_;
      uStack_750 = local_12c0._48_8_;
      uStack_748 = local_12c0._56_8_;
      local_400 = local_12c0._0_8_;
      uStack_3f8 = local_12c0._8_8_;
      uStack_3f0 = local_12c0._16_8_;
      uStack_3e8 = local_12c0._24_8_;
      uStack_3e0 = local_12c0._32_8_;
      uStack_3d8 = local_12c0._40_8_;
      uStack_3d0 = local_12c0._48_8_;
      uStack_3c8 = local_12c0._56_8_;
      local_6e0 = local_12c0._0_8_;
      uStack_6d8 = local_12c0._8_8_;
      uStack_6d0 = local_12c0._16_8_;
      uStack_6c8 = local_12c0._24_8_;
      auVar13 = vextractf64x4_avx512f(local_12c0,1);
      stack0xfffffffffffff1e0 = auVar13;
      _local_7a0 = vmaxps_avx(auVar3,local_700);
      local_320 = local_7a0._0_8_;
      uStack_318 = local_7a0._8_8_;
      uStack_310 = local_7a0._16_8_;
      uStack_308 = uStack_788;
      uStack_678 = uStack_788;
      local_680 = local_7a0._16_8_;
      local_7b0 = vmaxps_avx(stack0xfffffffffffff870,local_690);
      local_710 = local_7b0._0_8_;
      uStack_708 = local_7b0._8_8_;
      local_720 = local_7b0._0_8_;
      uStack_718 = local_7b0._8_8_;
      local_6b0 = vunpckhpd_avx(local_7b0,local_7b0);
      local_6a0 = local_7b0._0_8_;
      uStack_698 = local_7b0._8_8_;
      local_7c0 = vmaxps_avx(local_7b0,local_6b0);
      local_280 = local_7c0._0_8_;
      uStack_278 = local_7c0._8_8_;
      local_290 = local_7c0._4_4_;
      uStack_28c = local_7c0._4_4_;
      uStack_288 = local_7c0._4_4_;
      uStack_284 = local_7c0._4_4_;
      auVar6._4_4_ = local_7c0._4_4_;
      auVar6._0_4_ = local_7c0._4_4_;
      auVar6._8_4_ = local_7c0._4_4_;
      auVar6._12_4_ = local_7c0._4_4_;
      local_7d0 = vmaxss_avx(local_7c0,auVar6);
      local_250 = local_7d0._0_8_;
      uVar11 = local_250;
      uStack_248 = local_7d0._8_8_;
      local_250._0_4_ = local_7d0._0_4_;
      local_1504 = (float)local_250;
      local_250 = uVar11;
      pfVar12 = std::max<float>(&local_12f4,&local_1504);
      local_12f4 = *pfVar12;
      local_640 = local_12e0._0_8_;
      uStack_638 = local_12e0._8_8_;
      uStack_630 = local_12e0._16_8_;
      uStack_628 = local_12e0._24_8_;
      local_340 = local_12e0._0_8_;
      uStack_338 = local_12e0._8_8_;
      uStack_330 = local_12e0._16_8_;
      uStack_328 = local_12e0._24_8_;
      local_5c0 = local_12e0._16_8_;
      uStack_5b8 = local_12e0._24_8_;
      local_5d0 = local_12e0._0_8_;
      uStack_5c8 = local_12e0._8_8_;
      local_650 = vmaxps_avx(local_12e0._16_16_,local_12e0._0_16_);
      local_600 = local_650._0_8_;
      uStack_5f8 = local_650._8_8_;
      local_610 = local_650._0_8_;
      uStack_608 = local_650._8_8_;
      local_5f0 = vunpckhpd_avx(local_650,local_650);
      local_5e0 = local_650._0_8_;
      uStack_5d8 = local_650._8_8_;
      local_660 = vmaxps_avx(local_650,local_5f0);
      local_2a0 = local_660._0_8_;
      uStack_298 = local_660._8_8_;
      local_2b0 = local_660._4_4_;
      uStack_2ac = local_660._4_4_;
      uStack_2a8 = local_660._4_4_;
      uStack_2a4 = local_660._4_4_;
      auVar5._4_4_ = local_660._4_4_;
      auVar5._0_4_ = local_660._4_4_;
      auVar5._8_4_ = local_660._4_4_;
      auVar5._12_4_ = local_660._4_4_;
      local_670 = vmaxss_avx(local_660,auVar5);
      local_260 = local_670._0_8_;
      uVar11 = local_260;
      uStack_258 = local_670._8_8_;
      local_260._0_4_ = local_670._0_4_;
      local_1508 = (float)local_260;
      local_260 = uVar11;
      pfVar12 = std::max<float>(&local_12f4,&local_1508);
      local_12f4 = *pfVar12;
      local_590 = local_12f0._0_8_;
      uStack_588 = local_12f0._8_8_;
      local_570 = local_12f0._0_8_;
      uStack_568 = local_12f0._8_8_;
      local_580 = local_12f0._0_8_;
      uStack_578 = local_12f0._8_8_;
      local_560 = vunpckhpd_avx(local_12f0,local_12f0);
      local_550 = local_12f0._0_8_;
      uStack_548 = local_12f0._8_8_;
      local_5a0 = vmaxps_avx(local_12f0,local_560);
      local_2c0 = local_5a0._0_8_;
      uStack_2b8 = local_5a0._8_8_;
      local_2d0 = local_5a0._4_4_;
      uStack_2cc = local_5a0._4_4_;
      uStack_2c8 = local_5a0._4_4_;
      uStack_2c4 = local_5a0._4_4_;
      auVar4._4_4_ = local_5a0._4_4_;
      auVar4._0_4_ = local_5a0._4_4_;
      auVar4._8_4_ = local_5a0._4_4_;
      auVar4._12_4_ = local_5a0._4_4_;
      local_5b0 = vmaxss_avx(local_5a0,auVar4);
      local_270 = local_5b0._0_8_;
      uVar11 = local_270;
      uStack_268 = local_5b0._8_8_;
      local_270._0_4_ = local_5b0._0_4_;
      local_150c = (float)local_270;
      local_270 = uVar11;
      pfVar12 = std::max<float>(&local_12f4,&local_150c);
      fVar1 = *pfVar12;
      *local_1158 = 127.0 / fVar1;
      *local_1160 = fVar1 / local_114c;
      local_1158 = local_1158 + 1;
      local_1160 = local_1160 + 1;
    }
    auVar13._0_16_ = local_480;
  }
  return;
}

Assistant:

static void compute_A_tile_fp32_int8_scales(const Mat& A, Mat& scales, float B_scale, Mat& out_descales, int i, int max_ii)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    // NCNN_LOGE("compute_A_tile_int8_scales %d %d", max_ii, elempack);

    const float v127_B_scale = 127.f * B_scale;

    float* ps = (float*)scales + i;
    float* pods = (float*)out_descales + i;

    const int max_ii_packed = max_ii / elempack;
    const int size = A.w * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _v127_avx512 = _mm512_set1_ps(127.f);
    __m512 _v127_B_scale_avx512 = _mm512_set1_ps(v127_B_scale);
#endif // __AVX512F__
    __m256 _v127_avx = _mm256_set1_ps(127.f);
    __m256 _v127_B_scale_avx = _mm256_set1_ps(v127_B_scale);
#endif // __AVX__
    __m128 _v127 = _mm_set1_ps(127.f);
    __m128 _v127_B_scale = _mm_set1_ps(v127_B_scale);
#endif // __SSE2__

    for (int ii = 0; ii < max_ii_packed; ii++)
    {
        const float* ptr = (const float*)A + (i + ii * elempack) * A_hstep;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _absmax_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
        __m256 _absmax_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
        __m128 _absmax = _mm_set1_ps(0.f);
#endif // __SSE2__
        float absmax = 0.f;

        int kk = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; kk + 15 < size; kk += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _absmax_avx512 = _mm512_max_ps(_absmax_avx512, abs512_ps(_p));
            ptr += 16;
        }
#endif // __AVX512F__
        for (; kk + 7 < size; kk += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _absmax_avx = _mm256_max_ps(_absmax_avx, abs256_ps(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; kk + 3 < size; kk += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _absmax = _mm_max_ps(_absmax, abs_ps(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; kk < size; kk++)
        {
            absmax = std::max(absmax, (float)fabsf(*ptr));
            ptr++;
        }

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            __m512 _scale = _mm512_div_ps(_v127_avx512, _absmax_avx512);
            __m512 _out_descale = _mm512_div_ps(_absmax_avx512, _v127_B_scale_avx512);
            _mm512_store_ps(ps, _scale);
            _mm512_store_ps(pods, _out_descale);
            ps += 16;
            pods += 16;
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            {
                __m256 _absmax0 = _mm512_castps512_ps256(_absmax_avx512);
                __m256 _absmax1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_absmax_avx512), 1));
                _absmax_avx = _mm256_max_ps(_absmax_avx, _absmax0);
                _absmax_avx = _mm256_max_ps(_absmax_avx, _absmax1);
            }
#endif // __AVX512F__

            __m256 _scale = _mm256_div_ps(_v127_avx, _absmax_avx);
            __m256 _out_descale = _mm256_div_ps(_absmax_avx, _v127_B_scale_avx);
            _mm256_store_ps(ps, _scale);
            _mm256_store_ps(pods, _out_descale);
            ps += 8;
            pods += 8;
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            {
                __m256 _absmax0 = _mm512_castps512_ps256(_absmax_avx512);
                __m256 _absmax1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_absmax_avx512), 1));
                _absmax_avx = _mm256_max_ps(_absmax_avx, _absmax0);
                _absmax_avx = _mm256_max_ps(_absmax_avx, _absmax1);
            }
#endif // __AVX512F__
            {
                __m128 _absmax0 = _mm256_castps256_ps128(_absmax_avx);
                __m128 _absmax1 = _mm256_extractf128_ps(_absmax_avx, 1);
                _absmax = _mm_max_ps(_absmax, _absmax0);
                _absmax = _mm_max_ps(_absmax, _absmax1);
            }
#endif // __AVX__

            __m128 _scale = _mm_div_ps(_v127, _absmax);
            __m128 _out_descale = _mm_div_ps(_absmax, _v127_B_scale);
            _mm_store_ps(ps, _scale);
            _mm_store_ps(pods, _out_descale);
            ps += 4;
            pods += 4;
        }
#endif // __SSE2__
        if (elempack == 1)
        {
#if __SSE2__
#if __AVX__
#if __AVX512F__
            absmax = std::max(absmax, _mm512_comp_reduce_max_ps(_absmax_avx512));
#endif // __AVX512F__
            absmax = std::max(absmax, _mm256_reduce_max_ps(_absmax_avx));
#endif // __AVX__
            absmax = std::max(absmax, _mm_reduce_max_ps(_absmax));
#endif // __SSE2__

            ps[0] = 127.f / absmax;
            pods[0] = absmax / v127_B_scale;
            ps++;
            pods++;
        }
    }
}